

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# algorithm.hpp
# Opt level: O0

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
boost::unit_test::utils::
replace_all_occurrences_of<std::__cxx11::string,std::__cxx11::string_const*>
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *str,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *first1,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *last1,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *first2,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *last2)

{
  string *psVar1;
  ulong in_RCX;
  ulong in_RDX;
  string *in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  long in_R8;
  long in_R9;
  size_t found;
  ulong local_38;
  long local_28;
  ulong local_18;
  
  local_28 = in_R8;
  for (local_18 = in_RDX; local_18 != in_RCX && local_28 != in_R9; local_18 = local_18 + 0x20) {
    local_38 = std::__cxx11::string::find(in_RSI,local_18);
    while (local_38 != 0xffffffffffffffff) {
      psVar1 = (string *)std::__cxx11::string::size();
      std::__cxx11::string::replace((ulong)in_RSI,local_38,psVar1);
      std::__cxx11::string::size();
      local_38 = std::__cxx11::string::find(in_RSI,local_18);
    }
    local_28 = local_28 + 0x20;
  }
  std::__cxx11::string::string((string *)in_RDI,in_RSI);
  return in_RDI;
}

Assistant:

inline StringClass
replace_all_occurrences_of( StringClass str,
                            ForwardIterator first1, ForwardIterator last1,
                            ForwardIterator first2, ForwardIterator last2)
{
    for(; first1 != last1 && first2 != last2; ++first1, ++first2) {
        std::size_t found = str.find( *first1 );
        while( found != StringClass::npos ) {
            str.replace(found, first1->size(), *first2 );
            found = str.find( *first1, found + first2->size() );
        }
    }

    return str;
}